

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EM.cpp
# Opt level: O3

void __thiscall EM::em_alg(EM *this,int cl)

{
  vector<double,std::allocator<double>> *this_00;
  pointer plVar1;
  pointer pvVar2;
  pointer pvVar3;
  double __x;
  undefined1 auVar4 [16];
  pointer pvVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  pointer pPVar14;
  pointer pdVar15;
  double *pdVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  iterator iVar21;
  EM *pEVar22;
  EM *pEVar23;
  ulong uVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  size_type __n;
  int j;
  ulong uVar28;
  longdouble in_ST0;
  longdouble lVar29;
  longdouble in_ST1;
  longdouble lVar30;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  l;
  vector<double,_std::allocator<double>_> W;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  r;
  vector<double,_std::allocator<double>_> Wtmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  C;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  X;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Ctmp;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Rtmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Y;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  R;
  undefined1 local_2b8 [48];
  undefined8 local_288;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined4 uStack_27c;
  pointer local_278;
  vector<double,_std::allocator<double>_> local_270;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_258;
  vector<double,_std::allocator<double>_> local_238;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_218;
  EM *local_1f8;
  long local_1f0;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_1e8;
  vector<long_double,_std::allocator<long_double>_> local_1d0;
  longdouble local_1b4;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_1a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_190;
  size_type local_178;
  ulong local_170;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_168;
  ulong local_150;
  long local_148;
  long local_140;
  pointer local_138;
  double local_130;
  double local_128;
  pointer local_120;
  double local_118;
  double local_110;
  pointer local_108;
  longdouble local_fc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_78;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_190,(long)this->points_nmb,(allocator_type *)&local_218);
  if (0 < this->points_nmb) {
    lVar18 = 0;
    lVar27 = 0;
    do {
      this_00 = (vector<double,std::allocator<double>> *)
                ((long)&((local_190.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar18);
      pPVar14 = (this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar16 = (double *)((long)&pPVar14->x + lVar18);
      iVar21._M_current =
           *(double **)
            ((long)&((local_190.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + lVar18);
      pdVar25 = *(double **)
                 ((long)&((local_190.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage + lVar18);
      if (iVar21._M_current == pdVar25) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (this_00,iVar21,pdVar16);
        pPVar14 = (this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar21._M_current =
             *(double **)
              ((long)&((local_190.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish + lVar18);
        pdVar25 = *(double **)
                   ((long)&((local_190.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar18);
      }
      else {
        *iVar21._M_current = *pdVar16;
        iVar21._M_current = iVar21._M_current + 1;
        *(double **)(this_00 + 8) = iVar21._M_current;
      }
      pdVar16 = (double *)((long)&pPVar14->y + lVar18);
      if (iVar21._M_current == pdVar25) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)
                   ((long)&((local_190.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar18),iVar21,pdVar16);
      }
      else {
        *iVar21._M_current = *pdVar16;
        *(double **)
         ((long)&((local_190.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish + lVar18) = iVar21._M_current + 1;
      }
      lVar27 = lVar27 + 1;
      lVar18 = lVar18 + 0x18;
    } while (lVar27 < this->points_nmb);
  }
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_218.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_218.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<double,_std::allocator<double>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_218.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<double,_std::allocator<double>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_218.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<double,_std::allocator<double>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar19 = (ulong)(uint)cl;
  local_2b8._24_8_ = (pointer)(ulong)(uint)cl;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_218.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < cl) {
    iVar17 = 0;
    do {
      lVar18 = 0;
      bVar11 = true;
      do {
        bVar20 = bVar11;
        std::vector<double,_std::allocator<double>_>::resize
                  (local_218.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar18,uVar19);
        uVar28 = 0;
        do {
          iVar12 = rand();
          local_218.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar18].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar28] = (double)(iVar12 % 1000) / 1000.0;
          uVar28 = uVar28 + 1;
        } while (uVar19 != uVar28);
        lVar18 = 1;
        bVar11 = false;
      } while (bVar20);
      iVar17 = iVar17 + 1;
      cl = (int)local_2b8._24_8_;
    } while (iVar17 != cl);
  }
  local_178 = (size_type)cl;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&local_168,local_178,(allocator_type *)&local_270);
  local_1f8 = this;
  if (0 < cl) {
    local_2b8._32_8_ = uVar19 * 0x18;
    pPVar14 = (pointer)0x0;
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uStack_280 = 0;
    uStack_27e = 0;
    uStack_27c = 0x3ff00000;
    do {
      pvVar5 = local_168.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1e8.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
      local_1e8.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_1e8;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_270,__l,(allocator_type *)&local_1d0);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)((long)&pPVar14->eps +
                    (long)&pvVar5->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ),&local_270);
      if ((pointer)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar5 = local_168.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1e8.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(local_288._4_4_,(int)local_288);
      local_1e8.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(uStack_27c,CONCAT22(uStack_27e,uStack_280));
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_1e8;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_270,__l_00,(allocator_type *)&local_1d0);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)((long)&pPVar14->eps +
                    (long)&pvVar5->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ),&local_270);
      this = local_1f8;
      if ((pointer)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pPVar14 = pPVar14 + 1;
    } while ((pointer)local_2b8._32_8_ != pPVar14);
  }
  __n = local_178;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_270,local_178,(allocator_type *)&local_1e8);
  auVar4 = _DAT_001168e0;
  if (0 < (int)local_2b8._24_4_) {
    lVar18 = uVar19 - 1;
    auVar31._8_4_ = (int)lVar18;
    auVar31._0_8_ = lVar18;
    auVar31._12_4_ = (int)((ulong)lVar18 >> 0x20);
    lVar18 = 0;
    auVar31 = auVar31 ^ _DAT_001168e0;
    auVar32 = _DAT_001168d0;
    do {
      auVar33 = auVar32 ^ auVar4;
      if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                  auVar31._4_4_ < auVar33._4_4_) & 1)) {
        *(double *)
         ((long)&(((vector<Point,_std::allocator<Point>_> *)
                  local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start)->
                 super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.super__Vector_impl_data.
                 _M_start + lVar18) = 1.0 / (double)(int)local_2b8._24_4_;
      }
      if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
          auVar33._12_4_ <= auVar31._12_4_) {
        *(double *)
         ((long)&(((vector<Point,_std::allocator<Point>_> *)
                  local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start)->
                 super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.super__Vector_impl_data.
                 _M_finish + lVar18) = 1.0 / (double)(int)local_2b8._24_4_;
      }
      lVar27 = auVar32._8_8_;
      auVar32._0_8_ = auVar32._0_8_ + 2;
      auVar32._8_8_ = lVar27 + 2;
      lVar18 = lVar18 + 0x10;
    } while ((ulong)(local_2b8._24_4_ + 1 >> 1) << 4 != lVar18);
  }
  iVar17 = this->points_nmb;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _0_10_ = (BADTYPE)0;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            (&local_1d0,__n,(value_type_conflict3 *)&local_238,(allocator_type *)&local_1a8);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector(&local_1e8,(long)iVar17,&local_1d0,(allocator_type *)local_2b8);
  if (local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_148 = uVar19 * 8;
  local_140 = uVar19 * 0x18;
  uVar28 = 0;
  lVar30 = (longdouble)2.1;
  local_170 = uVar19;
  do {
    local_1a8.
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lVar29 = in_ST5;
    local_fc = lVar30;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_238,__n,(value_type_conflict1 *)&local_1a8,(allocator_type *)local_2b8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&local_1d0,2,&local_238,(allocator_type *)&local_258);
    if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_1a8.
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_238,__n,(value_type_conflict1 *)&local_1a8,(allocator_type *)local_2b8);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector(&local_1a8,__n,(allocator_type *)local_2b8);
    if (0 < (int)local_2b8._24_4_) {
      lVar18 = 0;
      do {
        pvVar5 = local_1a8.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_258.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_258.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)&local_258;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_2b8,__l_01,
                   (allocator_type *)&local_278);
        std::
        vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
        ::emplace_back<std::vector<double,std::allocator<double>>>
                  ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                    *)((long)&(pvVar5->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar18),
                   (vector<double,_std::allocator<double>_> *)local_2b8);
        if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
        }
        pvVar5 = local_1a8.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_258.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_258.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&local_258;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_2b8,__l_02,
                   (allocator_type *)&local_278);
        std::
        vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
        ::emplace_back<std::vector<double,std::allocator<double>>>
                  ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                    *)((long)&(pvVar5->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar18),
                   (vector<double,_std::allocator<double>_> *)local_2b8);
        if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
        }
        lVar18 = lVar18 + 0x18;
      } while (local_140 != lVar18);
    }
    uVar13 = (ulong)(uint)this->points_nmb;
    local_1b4 = (longdouble)0;
    local_150 = uVar28;
    if (0 < this->points_nmb) {
      local_1f0 = 0;
      local_1b4 = (longdouble)0;
      do {
        lVar18 = local_1f0;
        lVar30 = in_ST0;
        lVar6 = in_ST1;
        lVar7 = in_ST2;
        lVar8 = in_ST3;
        lVar9 = in_ST4;
        lVar10 = in_ST5;
        if (0 < (int)local_2b8._24_4_) {
          uVar19 = 0;
          lVar30 = (longdouble)0;
          local_288._0_4_ = SUB104(lVar30,0);
          local_288._4_4_ = (int)((unkuint10)lVar30 >> 0x20);
          uStack_280 = (undefined2)((unkuint10)lVar30 >> 0x40);
          do {
            local_2b8._0_8_ = (pointer)0x0;
            local_2b8._8_8_ = (pointer)0x0;
            local_2b8._16_8_ = (pointer)0x0;
            local_2b8._0_8_ = operator_new(0x30);
            local_2b8._8_8_ = local_2b8._0_8_ + 0x30;
            (((pointer)(local_2b8._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            (((pointer)(local_2b8._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            (((pointer)local_2b8._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (((pointer)(local_2b8._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((pointer)local_2b8._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (((pointer)local_2b8._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar27 = 0;
            pEVar23 = (EM *)local_2b8;
            lVar30 = in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = lVar29;
            bVar11 = true;
            local_2b8._16_8_ = local_2b8._8_8_;
            do {
              bVar20 = bVar11;
              local_258.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(local_190.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar18].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar27] -
                            local_218.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar27].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar19]);
              iVar21._M_current =
                   &((((pointer)(local_2b8._0_8_ + lVar27 * 0x18))->points).
                     super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_finish)->eps;
              if ((pointer)iVar21._M_current ==
                  (((pointer)(local_2b8._0_8_ + lVar27 * 0x18))->points).
                  super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)
                           (local_2b8._0_8_ + lVar27 * 0x18),iVar21,(double *)&local_258);
              }
              else {
                *iVar21._M_current =
                     (double)local_258.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                (((_Vector_base<double,_std::allocator<double>_> *)
                 &((pointer)(local_2b8._0_8_ + lVar27 * 0x18))->points)->_M_impl).
                super__Vector_impl_data._M_finish = iVar21._M_current + 1;
              }
              lVar27 = 1;
              bVar11 = false;
            } while (bVar20);
            pEVar22 = pEVar23;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_a8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)pEVar23);
            matrix_transporation(&local_f0,pEVar22,&local_a8);
            pEVar22 = (EM *)(local_168.
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar19);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_d8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)pEVar22);
            matrix_reversal(&local_c0,pEVar22,&local_d8);
            matrix_composition(&local_90,pEVar22,&local_f0,&local_c0);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&stack0xffffffffffffffb8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)pEVar23);
            matrix_composition(&local_258,pEVar23,&local_90,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&stack0xffffffffffffffb8);
            local_2b8._32_10_ =
                 (unkbyte10)
                 *(double *)
                  &(((((_Vector_base<Cluster,_std::allocator<Cluster>_> *)
                      &(local_258.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                     super__Vector_impl_data._M_start)->points).
                   super__Vector_base<Point,_std::allocator<Point>_>._M_impl;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_258);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&stack0xffffffffffffffb8);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_90);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_c0);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_d8);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_f0);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_a8);
            local_138 = (&(((vector<Point,_std::allocator<Point>_> *)
                           local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start)->
                          super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                          super__Vector_impl_data._M_start)[uVar19];
            expl();
            pEVar23 = (EM *)&stack0xffffffffffffffa0;
            local_2b8._32_10_ = lVar30;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&stack0xffffffffffffffa0,
                     local_168.
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar19);
            local_108 = local_138;
            local_2b8._32_10_ =
                 ((longdouble)local_2b8._32_10_ * (longdouble)(double)local_138) /
                 (longdouble)2.5066282731988805;
            __x = determinat(pEVar23,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      *)&stack0xffffffffffffffa0);
            if (__x < 0.0) {
              local_110 = sqrt(__x);
            }
            else {
              local_110 = SQRT(__x);
            }
            lVar27 = local_1f0;
            local_1e8.
            super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1f0].
            super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] =
                 (longdouble)local_2b8._32_10_ / (longdouble)local_110;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&stack0xffffffffffffffa0);
            lVar30 = (longdouble)CONCAT28(uStack_280,CONCAT44(local_288._4_4_,(int)local_288)) +
                     local_1e8.
                     super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar27].
                     super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19];
            local_288._0_4_ = SUB104(lVar30,0);
            local_288._4_4_ = (int)((unkuint10)lVar30 >> 0x20);
            uStack_280 = (undefined2)((unkuint10)lVar30 >> 0x40);
            lVar29 = in_ST5;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_2b8);
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_170);
          this = local_1f8;
          uVar19 = local_170;
          lVar30 = in_ST0;
          lVar6 = in_ST1;
          lVar7 = in_ST2;
          lVar8 = in_ST3;
          lVar9 = in_ST4;
          lVar10 = in_ST5;
          local_288 = CONCAT44(local_288._4_4_,(int)local_288);
          if (0 < (int)local_2b8._24_4_) {
            plVar1 = local_1e8.
                     super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar27].
                     super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar25 = local_190.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar27].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar18 = *(long *)local_1d0.
                              super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                              super__Vector_impl_data._M_start;
            lVar27 = *(long *)((long)local_1d0.
                                     super__Vector_base<long_double,_std::allocator<long_double>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 0x18);
            lVar26 = 0;
            do {
              lVar29 = *(longdouble *)((long)plVar1 + lVar26 * 2) /
                       (longdouble)CONCAT28(uStack_280,CONCAT44(local_288._4_4_,(int)local_288));
              *(longdouble *)((long)plVar1 + lVar26 * 2) = lVar29;
              *(double *)
               ((long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar26) =
                   (double)(lVar29 + (longdouble)
                                     *(double *)
                                      ((long)local_238.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start + lVar26));
              *(double *)(lVar18 + lVar26) =
                   (double)(lVar29 * (longdouble)*pdVar25 + (longdouble)*(double *)(lVar18 + lVar26)
                           );
              *(double *)(lVar27 + lVar26) =
                   (double)(lVar29 * (longdouble)pdVar25[1] +
                           (longdouble)*(double *)(lVar27 + lVar26));
              lVar26 = lVar26 + 8;
              lVar10 = in_ST4;
              lVar29 = in_ST4;
              local_288 = CONCAT44(local_288._4_4_,(int)local_288);
            } while (local_148 != lVar26);
          }
        }
        in_ST5 = lVar29;
        in_ST4 = lVar10;
        in_ST3 = lVar9;
        in_ST2 = lVar8;
        in_ST1 = lVar7;
        in_ST0 = lVar6;
        logl();
        local_1b4 = local_1b4 + lVar30;
        local_1f0 = local_1f0 + 1;
        uVar13 = (ulong)this->points_nmb;
        lVar29 = in_ST5;
      } while (local_1f0 < (long)uVar13);
    }
    if (0 < (int)local_2b8._24_4_) {
      uVar28 = 0;
      pdVar15 = local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        ((local_218.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar28] =
             *(double *)
              (*(long *)local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar28 * 8) / pdVar15[uVar28];
        local_218.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar28] = *(double *)
                    (*(long *)((long)local_1d0.
                                     super__Vector_base<long_double,_std::allocator<long_double>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 0x18) + uVar28 * 8)
                   / pdVar15[uVar28];
        if (0 < (int)uVar13) {
          local_288 = 0;
          do {
            local_2b8._0_8_ = (pointer)0x0;
            local_2b8._8_8_ = (pointer)0x0;
            local_2b8._16_8_ = (pointer)0x0;
            local_2b8._0_8_ = operator_new(0x30);
            local_2b8._8_8_ = local_2b8._0_8_ + 0x30;
            (((pointer)(local_2b8._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            (((pointer)(local_2b8._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            (((pointer)local_2b8._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (((pointer)(local_2b8._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((pointer)local_2b8._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (((pointer)local_2b8._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2b8._16_8_ = local_2b8._8_8_;
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((pointer)local_258.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2);
            ((pointer)
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)[1].
            super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            ((pointer)
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)[1].
            super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            (((pointer)
             local_258.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<Cluster,_std::allocator<Cluster>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            ((pointer)
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)[1].
            super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((pointer)
             local_258.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<Cluster,_std::allocator<Cluster>_>)._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((pointer)
             local_258.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<Cluster,_std::allocator<Cluster>_>)._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            lVar18 = 0;
            bVar11 = true;
            local_258.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_258.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            do {
              lVar27 = local_288;
              bVar20 = bVar11;
              local_118 = local_190.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar27].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18] -
                          local_218.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar18].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar28];
              local_278 = (pointer)(double)(local_1e8.
                                            super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar27].
                                            super__Vector_base<long_double,_std::allocator<long_double>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar28] *
                                           (longdouble)local_118);
              iVar21._M_current =
                   &((((pointer)(local_2b8._0_8_ + lVar18 * 0x18))->points).
                     super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_finish)->eps;
              local_120 = local_278;
              local_288 = lVar27;
              if ((pointer)iVar21._M_current ==
                  (((pointer)(local_2b8._0_8_ + lVar18 * 0x18))->points).
                  super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)
                           (local_2b8._0_8_ + lVar18 * 0x18),iVar21,(double *)&local_278);
              }
              else {
                *iVar21._M_current = (double)local_278;
                (((_Vector_base<double,_std::allocator<double>_> *)
                 &((pointer)(local_2b8._0_8_ + lVar18 * 0x18))->points)->_M_impl).
                super__Vector_impl_data._M_finish = iVar21._M_current + 1;
              }
              local_278 = (pointer)(local_190.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[local_288].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar18] -
                                   local_218.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar28]);
              iVar21._M_current =
                   (double *)
                   (((pointer)
                    (local_258.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar18))->
                   super__Vector_base<Cluster,_std::allocator<Cluster>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if ((pointer)iVar21._M_current ==
                  (((pointer)
                   (local_258.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar18))->
                  super__Vector_base<Cluster,_std::allocator<Cluster>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)
                           (local_258.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar18),iVar21,
                           (double *)&local_278);
              }
              else {
                *iVar21._M_current = (double)local_278;
                (((pointer)
                 (local_258.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar18))->
                super__Vector_base<Cluster,_std::allocator<Cluster>_>)._M_impl.
                super__Vector_impl_data._M_finish = (pointer)(iVar21._M_current + 1);
              }
              lVar18 = 1;
              bVar11 = false;
            } while (bVar20);
            pdVar25 = local_190.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar27].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_128 = *pdVar25 -
                        ((local_218.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar28];
            local_128 = local_128 * local_128;
            lVar30 = local_1e8.
                     super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar27].
                     super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar28];
            pvVar2 = local_1a8.
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar28].
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar16 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            *pdVar16 = (double)(lVar30 * (longdouble)local_128 + (longdouble)*pdVar16);
            local_130 = pdVar25[1] -
                        local_218.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar28];
            local_130 = local_130 * local_130;
            lVar18 = *(long *)&pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data;
            *(double *)(lVar18 + 8) =
                 (double)(lVar30 * (longdouble)local_130 + (longdouble)*(double *)(lVar18 + 8));
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_258);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_2b8);
            local_288 = local_288 + 1;
            uVar13 = (ulong)local_1f8->points_nmb;
          } while (local_288 < (long)uVar13);
          pdVar15 = local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          this = local_1f8;
          uVar19 = local_170;
        }
        uVar24 = 0;
        do {
          (&(((vector<Point,_std::allocator<Point>_> *)
             local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start)->super__Vector_base<Point,_std::allocator<Point>_>).
            _M_impl.super__Vector_impl_data._M_start)[uVar24] =
               (pointer)(pdVar15[uVar24] / (double)(int)uVar13);
          uVar24 = uVar24 + 1;
        } while (uVar19 != uVar24);
        pvVar2 = local_1a8.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar28].
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = local_168.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar28].
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start =
             *(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start / pdVar15[uVar28];
        *(double *)
         (*(long *)&pvVar3[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8) =
             *(double *)
              (*(long *)&pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) / pdVar15[uVar28];
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar19);
    }
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::vector(&local_78,&local_1e8);
    make_clusters(this,&local_78,(int)local_2b8._24_8_);
    uVar13 = local_150;
    __n = local_178;
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector(&local_1a8);
    if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_1d0);
  } while (((longdouble)0.1 <= ABS(local_1b4 - local_fc)) &&
          (uVar28 = (ulong)((uint)uVar13 + 1), lVar30 = local_1b4, in_ST5 = in_ST4,
          (uint)uVar13 < 0x31));
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector(&local_1e8);
  if ((pointer)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_218);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_190);
  return;
}

Assistant:

void EM:: em_alg(int cl) {
    int dim=2;
    double e=0.1;
    int Q=0;
    vector<vector<double>> Y(points_nmb);//xi
    for(int i=0;i<points_nmb;i++)//point_nmb*dim
    {
        Y[i].push_back(f.all_points[i].x);
        Y[i].push_back(f.all_points[i].y);
    }


    vector<vector<double>> C(dim);//mathematical expectation

    for(int i=0;i<cl;i++) {
        for (int i = 0; i < 2; i++) {
            C[i].resize(cl);

            for (int j = 0; j < cl; j++) {
                C[i][j] = (double)(rand() % 1000)/1000;

            }
        }
    }


    vector<vector<vector<double>>> R(cl);//sigma covariation matrix

    for(int i=0;i<cl;i++) {
        R[i].push_back({1,0});
        R[i].push_back({0,1});

    }


    vector<double> W(cl);

    for(int i=0;i<cl;i++) {
        W[i] = (double) 1 / cl;
    }


    vector<vector<long double>>X(points_nmb, vector<long double>(cl, 0));



    long double llh=0,llh2=e+2;
    long double sumpi=0;

    //start cycle
    while(fabs(llh2-llh)>=e and Q<50)
    {
        vector <vector <double> > Ctmp (dim, vector<double>(cl, 0));

        vector <double> Wtmp(cl, 0);

        Q++;
        llh=llh2;
        vector<vector<vector<double>>> Rtmp(cl);

        for(int i=0;i<cl;i++) {
            Rtmp[i].push_back({0,0});
            Rtmp[i].push_back({0,0});

        }

        llh2=0;
        for(int i=0;i<points_nmb;i++)
        {

            sumpi=0;
            for(int j=0;j<cl;j++)
            {
                vector<vector<double>> l(dim);

                for(int k=0;k<dim;k++)
                {
                    l[k].push_back(Y[i][k]-C[k][j]);

                }
                double sigma=matrix_composition(matrix_composition(matrix_transporation(l),matrix_reversal(R[j])),l)[0][0];//scalar product- mahalanobis distination
                X[i][j] = (long double)W[j] * expl((long double)-sigma/2)/sqrt(2*PI)/sqrt(determinat(R[j]));
                sumpi+=X[i][j];//found p(x)

            }
            for(int j=0;j<cl;j++) {
                X[i][j]/= sumpi;
                Wtmp[j]+=X[i][j];
                Ctmp[0][j]+= Y[i][0] * X[i][j];
                Ctmp[1][j]+=Y[i][1] * X[i][j];
            }

            llh2=llh2+log(sumpi);

        }

        for(int j=0;j<cl;j++)
        {
            for(int k=0;k<dim;k++)
            {
                C[k][j]=Ctmp[k][j]/Wtmp[j];
            }


            for(int i=0;i<points_nmb;i++)
            {
                vector<vector<double>> l(dim);
                vector<vector<double>> r(dim);
                for(int k=0;k<dim;k++)
                {
                    l[k].push_back((Y[i][k]-C[k][j])*X[i][j]);
                    r[k].push_back((Y[i][k]-C[k][j]));
                }

                Rtmp[j][0][0]+=(Y[i][0]-C[0][j])*(Y[i][0]-C[0][j])*X[i][j];
                Rtmp[j][1][1]+=(Y[i][1]-C[1][j])*(Y[i][1]-C[1][j])*X[i][j];
            }
            for (int i = 0; i < cl; i++) {
                W[i] = Wtmp[i]/points_nmb;
            }
            R[j][0][0] = Rtmp[j][0][0]/Wtmp[j];
            R[j][1][1] = Rtmp[j][1][1]/Wtmp[j];

        }
        make_clusters(X,cl);


    }



}